

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SegReaderCursorAppend(Fts3MultiSegReader *pCsr,Fts3SegReader *pNew)

{
  long lVar1;
  void *pvVar2;
  undefined8 in_RSI;
  long *in_RDI;
  sqlite3_int64 nByte;
  Fts3SegReader **apNew;
  
  if ((int)in_RDI[1] % 0x10 == 0) {
    pvVar2 = sqlite3_realloc64((void *)((long)((int)in_RDI[1] + 0x10) << 3),0x2401b8);
    if (pvVar2 == (void *)0x0) {
      sqlite3Fts3SegReaderFree((Fts3SegReader *)0x2401cf);
      return 7;
    }
    *in_RDI = (long)pvVar2;
  }
  lVar1 = in_RDI[1];
  *(int *)(in_RDI + 1) = (int)lVar1 + 1;
  *(undefined8 *)(*in_RDI + (long)(int)lVar1 * 8) = in_RSI;
  return 0;
}

Assistant:

static int fts3SegReaderCursorAppend(
  Fts3MultiSegReader *pCsr,
  Fts3SegReader *pNew
){
  if( (pCsr->nSegment%16)==0 ){
    Fts3SegReader **apNew;
    sqlite3_int64 nByte = (pCsr->nSegment + 16)*sizeof(Fts3SegReader*);
    apNew = (Fts3SegReader **)sqlite3_realloc64(pCsr->apSegment, nByte);
    if( !apNew ){
      sqlite3Fts3SegReaderFree(pNew);
      return SQLITE_NOMEM;
    }
    pCsr->apSegment = apNew;
  }
  pCsr->apSegment[pCsr->nSegment++] = pNew;
  return SQLITE_OK;
}